

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

uint nelbereths_at(level *lev,xchar x,xchar y)

{
  size_t sVar1;
  engr *peVar2;
  char *pcVar3;
  char *local_48;
  char *p;
  uint count;
  engr *ep;
  size_t s_len;
  char *s;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  sVar1 = strlen("Elbereth");
  peVar2 = engr_at(lev,x,y);
  p._4_4_ = 0;
  if ((peVar2 == (engr *)0x0) || (peVar2->engr_type == '\x06')) {
    lev_local._4_4_ = 0;
  }
  else {
    local_48 = peVar2->engr_txt;
    while( true ) {
      pcVar3 = strstri(local_48,"Elbereth");
      if (pcVar3 == (char *)0x0) break;
      p._4_4_ = p._4_4_ + 1;
      local_48 = local_48 + sVar1;
    }
    lev_local._4_4_ = p._4_4_;
  }
  return lev_local._4_4_;
}

Assistant:

static unsigned int nelbereths_at(struct level *lev, xchar x, xchar y)
{
	const char *s = "Elbereth";
	size_t s_len = strlen(s);
	struct engr *ep = engr_at(lev, x, y);
	unsigned int count = 0;
	const char *p;

	if (!ep || ep->engr_type == HEADSTONE)
	    return 0;

	p = ep->engr_txt;
	while (strstri(p, s)) {
	    count++;
	    p += s_len;
	}

	return count;
}